

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgelement.cpp
# Opt level: O3

StrokeData * __thiscall
lunasvg::SVGGraphicsElement::getStrokeData
          (StrokeData *__return_storage_ptr__,SVGGraphicsElement *this,SVGLayoutState *state)

{
  pointer pLVar1;
  pointer pfVar2;
  Length *dash;
  pointer length;
  float fVar3;
  LengthContext lengthContext;
  float local_5c;
  vector<float,_std::allocator<float>_> local_58;
  LengthContext local_40;
  
  local_40.m_units = UserSpaceOnUse;
  local_40.m_element = &this->super_SVGElement;
  fVar3 = LengthContext::valueForLength(&local_40,&state->m_stroke_width,Diagonal);
  __return_storage_ptr__->m_lineWidth = fVar3;
  __return_storage_ptr__->m_dashOffset = 0.0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->m_miterLimit = state->m_stroke_miterlimit;
  __return_storage_ptr__->m_lineCap = state->m_stroke_linecap;
  __return_storage_ptr__->m_lineJoin = state->m_stroke_linejoin;
  fVar3 = LengthContext::valueForLength(&local_40,&state->m_stroke_dashoffset,Diagonal);
  __return_storage_ptr__->m_dashOffset = fVar3;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._0_4_ = 0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start._4_4_ = 0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish._0_4_ = 0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish._4_4_ = 0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  length = (state->m_stroke_dasharray).
           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_start;
  pLVar1 = (state->m_stroke_dasharray).
           super__Vector_base<lunasvg::Length,_std::allocator<lunasvg::Length>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pfVar2 = (pointer)0x0;
  if (length != pLVar1) {
    do {
      local_5c = LengthContext::valueForLength(&local_40,length,Diagonal);
      if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
                  (&local_58,
                   (iterator)
                   local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_5c);
      }
      else {
        *local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_5c;
        local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      length = length + 1;
    } while (length != pLVar1);
    pfVar2 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  }
  *(undefined4 *)
   &(__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start =
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) =
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_start._4_4_;
  *(undefined4 *)
   &(__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_finish =
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  *(undefined4 *)
   ((long)&(__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) =
       local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  (__return_storage_ptr__->m_dashArray).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pfVar2;
  return __return_storage_ptr__;
}

Assistant:

StrokeData SVGGraphicsElement::getStrokeData(const SVGLayoutState& state) const
{
    LengthContext lengthContext(this);
    StrokeData strokeData(lengthContext.valueForLength(state.stroke_width(), LengthDirection::Diagonal));
    strokeData.setMiterLimit(state.stroke_miterlimit());
    strokeData.setLineCap(state.stroke_linecap());
    strokeData.setLineJoin(state.stroke_linejoin());
    strokeData.setDashOffset(lengthContext.valueForLength(state.stroke_dashoffset(), LengthDirection::Diagonal));

    DashArray dashArray;
    for(const auto& dash : state.stroke_dasharray())
        dashArray.push_back(lengthContext.valueForLength(dash, LengthDirection::Diagonal));
    strokeData.setDashArray(std::move(dashArray));
    return strokeData;
}